

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

int __thiscall
doctest::detail::MultiLaneAtomic<int>::operator=(MultiLaneAtomic<int> *this,int desired)

{
  int desired_local;
  MultiLaneAtomic<int> *this_local;
  
  store(this,desired,seq_cst);
  return desired;
}

Assistant:

T operator=(T desired) DOCTEST_NOEXCEPT { // lgtm [cpp/assignment-does-not-return-this]
            store(desired);
            return desired;
        }